

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.h
# Opt level: O0

void __thiscall
dg::Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>::Node
          (Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode> *this,Value **k)

{
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = *in_RSI;
  in_RDI[1] = 0;
  EdgesContainer<dg::LLVMNode,_4U>::EdgesContainer((EdgesContainer<dg::LLVMNode,_4U> *)0x1d3bc3);
  EdgesContainer<dg::LLVMNode,_4U>::EdgesContainer((EdgesContainer<dg::LLVMNode,_4U> *)0x1d3bd0);
  EdgesContainer<dg::LLVMNode,_4U>::EdgesContainer((EdgesContainer<dg::LLVMNode,_4U> *)0x1d3bdd);
  EdgesContainer<dg::LLVMNode,_4U>::EdgesContainer((EdgesContainer<dg::LLVMNode,_4U> *)0x1d3bed);
  EdgesContainer<dg::LLVMNode,_4U>::EdgesContainer((EdgesContainer<dg::LLVMNode,_4U> *)0x1d3bfd);
  EdgesContainer<dg::LLVMNode,_4U>::EdgesContainer((EdgesContainer<dg::LLVMNode,_4U> *)0x1d3c0d);
  EdgesContainer<dg::LLVMNode,_4U>::EdgesContainer((EdgesContainer<dg::LLVMNode,_4U> *)0x1d3c1d);
  EdgesContainer<dg::LLVMNode,_4U>::EdgesContainer((EdgesContainer<dg::LLVMNode,_4U> *)0x1d3c2d);
  std::
  set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
  ::set((set<dg::LLVMDependenceGraph_*,_std::less<dg::LLVMDependenceGraph_*>,_std::allocator<dg::LLVMDependenceGraph_*>_>
         *)0x1d3c3d);
  in_RDI[0x38] = 0;
  *(undefined4 *)(in_RDI + 0x39) = 0;
  in_RDI[0x3a] = 0;
  legacy::AnalysesAuxiliaryData::AnalysesAuxiliaryData((AnalysesAuxiliaryData *)(in_RDI + 0x3b));
  return;
}

Assistant:

Node(const KeyT &k) : key(k) {}